

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v4.cpp
# Opt level: O2

BOOL __thiscall
LASreadItemCompressed_BYTE14_v4::createAndInitModelsAndDecompressors
          (LASreadItemCompressed_BYTE14_v4 *this,U32 context,U8 *item)

{
  ArithmeticModel **ppAVar1;
  ArithmeticModel *pAVar2;
  U8 *pUVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (this->contexts[context].unused != false) {
    if (this->contexts[context].m_bytes == (ArithmeticModel **)0x0) {
      uVar5 = (ulong)this->number;
      ppAVar1 = (ArithmeticModel **)operator_new__(uVar5 << 3);
      this->contexts[context].m_bytes = ppAVar1;
      for (uVar4 = 0; uVar4 < uVar5; uVar4 = uVar4 + 1) {
        pAVar2 = ArithmeticDecoder::createSymbolModel(this->dec_Bytes[uVar4],0x100);
        this->contexts[context].m_bytes[uVar4] = pAVar2;
        ArithmeticDecoder::initSymbolModel
                  (this->dec_Bytes[uVar4],this->contexts[context].m_bytes[uVar4],(U32 *)0x0);
        uVar5 = (ulong)this->number;
      }
      pUVar3 = (U8 *)operator_new__(uVar5);
      this->contexts[context].last_item = pUVar3;
    }
    for (uVar4 = 0; uVar4 < this->number; uVar4 = uVar4 + 1) {
      ArithmeticDecoder::initSymbolModel
                (this->dec_Bytes[uVar4],this->contexts[context].m_bytes[uVar4],(U32 *)0x0);
    }
    memcpy(this->contexts[context].last_item,item,(ulong)this->number);
    this->contexts[context].unused = false;
    return true;
  }
  __assert_fail("contexts[context].unused",
                "/workspace/llm4binary/github/license_c_cmakelists/LASzip[P]LASzip/src/lasreaditemcompressed_v4.cpp"
                ,0x8a6,
                "BOOL LASreadItemCompressed_BYTE14_v4::createAndInitModelsAndDecompressors(U32, const U8 *)"
               );
}

Assistant:

inline BOOL LASreadItemCompressed_BYTE14_v4::createAndInitModelsAndDecompressors(U32 context, const U8* item)
{
  U32 i;

  /* should only be called when context is unused */

  assert(contexts[context].unused);

  /* first create all entropy models and last items (if needed) */

  if (contexts[context].m_bytes == 0)
  {
    contexts[context].m_bytes = new ArithmeticModel*[number];
    for (i = 0; i < number; i++)
    {
      contexts[context].m_bytes[i] = dec_Bytes[i]->createSymbolModel(256);
      dec_Bytes[i]->initSymbolModel(contexts[context].m_bytes[i]);
    }

    /* create last item */
    contexts[context].last_item = new U8[number];
  }

  /* then init entropy models */

  for (i = 0; i < number; i++)
  {
    dec_Bytes[i]->initSymbolModel(contexts[context].m_bytes[i]);
  }

  /* init current context from item */

  memcpy(contexts[context].last_item, item, number);

  contexts[context].unused = FALSE;

  return TRUE;
}